

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void __thiscall
polyscope::Histogram::smoothCurve
          (Histogram *this,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *xVals,
          vector<double,_std::allocator<double>_> *yVals)

{
  undefined1 auVar1 [16];
  pointer paVar2;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  vector<double,_std::allocator<double>_> smoothedVals;
  allocator_type local_51;
  double local_50;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  undefined1 extraout_var [56];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_40,
             (long)(yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_51);
  pdVar4 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar4) {
    uVar9 = 0;
    do {
      paVar2 = (xVals->
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pdVar5 == pdVar4) {
        local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar9] = 0.0;
        break;
      }
      local_50 = 0.0;
      lVar7 = 8;
      uVar8 = 0;
      local_48 = (paVar2[uVar9]._M_elems[0] + paVar2[uVar9]._M_elems[1]) * 0.5;
      do {
        paVar2 = (xVals->
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar3 = local_48 +
                (*(double *)((long)paVar2->_M_elems + lVar7 + -8) +
                *(double *)((long)paVar2->_M_elems + lVar7)) * -0.5;
        auVar10._0_8_ = exp(dVar3 * dVar3 * -1000.0);
        auVar10._8_56_ = extraout_var;
        pdVar4 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_50;
        pdVar5 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar7 = lVar7 + 0x10;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar4[uVar8];
        auVar1 = vfmadd231sd_fma(auVar11,auVar10._0_16_,auVar1);
        uVar8 = uVar8 + 1;
        uVar6 = (long)pdVar5 - (long)pdVar4 >> 3;
        local_50 = auVar1._0_8_;
      } while (uVar8 < uVar6);
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = local_50;
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar6);
  }
  std::vector<double,_std::allocator<double>_>::operator=(yVals,&local_40);
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Histogram::smoothCurve(std::vector<std::array<double, 2>>& xVals, std::vector<double>& yVals) {

  auto smoothFunc = [&](double x1, double x2) {
    // Tent
    // double radius = 0.1;
    // double val = (radius - std::abs(x1 - x2)) / radius;
    // return std::max(val, 0.0);

    // Gaussian
    double widthFactor = 1000;
    double dist = (x1 - x2);
    return std::exp(-dist * dist * widthFactor);

    // None
    // if(x1 == x2) return 1.0;
    // return 0.0;
  };

  std::vector<double> smoothedVals(yVals.size());
  for (size_t i = 0; i < yVals.size(); i++) {
    double bucketCi = 0.5 * (xVals[i][0] + xVals[i][1]);
    double sum = 0.0;
    for (size_t j = 0; j < yVals.size(); j++) {
      double bucketCj = 0.5 * (xVals[j][0] + xVals[j][1]);
      double weight = smoothFunc(bucketCi, bucketCj);
      sum += weight * yVals[j];
    }
    smoothedVals[i] = sum;
  }

  yVals = smoothedVals;
}